

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O2

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetStateCovariance
          (DiscreteKalmanFilterHelper *this,MatrixDynSize *P)

{
  size_t sVar1;
  MatrixDynSize *pMVar2;
  
  sVar1 = iDynTree::MatrixDynSize::rows();
  if ((sVar1 == this->m_dim_X) && (sVar1 = iDynTree::MatrixDynSize::cols(), sVar1 == this->m_dim_X))
  {
    pMVar2 = (MatrixDynSize *)iDynTree::MatrixDynSize::operator=(&this->m_P0,P);
    iDynTree::MatrixDynSize::operator=(&this->m_P,pMVar2);
    this->m_initial_state_covariance_set = true;
    return true;
  }
  iDynTree::reportError
            ("DiscreteKalmanFilterHelper","kfSetStateCovariance",
             "Could not set KF initial state covariance - dimension mismatch");
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetStateCovariance(const iDynTree::MatrixDynSize& P)
{
    if ( (P.rows() != m_dim_X) || (P.cols() != m_dim_X))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetStateCovariance", "Could not set KF initial state covariance - dimension mismatch");
        return false;
    }

    m_P = m_P0 = P;
    m_initial_state_covariance_set = true;
    return true;
}